

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

EC_T_BOOL __thiscall
CAtEmLogging::OsDbgMsgHook(CAtEmLogging *this,EC_T_CHAR *szFormat,__va_list_tag *vaArgs)

{
  uint local_24;
  EC_T_BOOL bPrint;
  __va_list_tag *vaArgs_local;
  EC_T_CHAR *szFormat_local;
  CAtEmLogging *this_local;
  
  local_24 = (uint)((this->m_bDbgMsgHookEnable != 0 ^ 0xffU) & 1);
  if (this->m_bDbgMsgHookEnable != 0) {
    if (this->m_pAllMsgBufferDesc == (MSG_BUFFER_DESC *)0x0) {
      local_24 = 1;
    }
    else if (this->m_pAllMsgBufferDesc->bIsInitialized == 0) {
      local_24 = 1;
    }
    else {
      InsertNewMsg(this,this->m_pAllMsgBufferDesc,szFormat,vaArgs,0,1);
    }
  }
  return local_24;
}

Assistant:

EC_T_BOOL CAtEmLogging::OsDbgMsgHook(const EC_T_CHAR* szFormat, EC_T_VALIST vaArgs)
{
EC_T_BOOL bPrint;

    bPrint = !m_bDbgMsgHookEnable;  // print messages outside as long as hook is not enabled
    if (m_bDbgMsgHookEnable)
    {
        if (m_pAllMsgBufferDesc != EC_NULL )
        {
            if (m_pAllMsgBufferDesc->bIsInitialized )
            {
                InsertNewMsg( m_pAllMsgBufferDesc, szFormat, vaArgs, EC_FALSE, EC_TRUE );
            }
            else
            {
                bPrint = EC_TRUE;
            }
        }
        else
        {
            bPrint = EC_TRUE;
        }
/*
        else
        {
            EC_T_CHAR   szMsg[256];

            OsVsnprintf(szMsg, 256, szFormat, vaArgs);
#ifdef VXWORKS
            logMsg( "%s", (int)szMsg, 2,3,4,5,6 );
#else
#if !(defined NOPRINTF)
            OsPrintf( "%s", szMsg );
#endif
#endif
        }
*/
    }
    return bPrint;
}